

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  int *piVar1;
  ImGuiTextRange *pIVar2;
  char *pcVar3;
  ImGuiTextRange *pIVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  ImGuiTextRange input_range;
  ImGuiTextRange local_38;
  
  iVar7 = (this->Filters).Capacity;
  if (iVar7 < 0) {
    uVar6 = iVar7 / 2 + iVar7;
    uVar11 = 0;
    if (0 < (int)uVar6) {
      uVar11 = (ulong)uVar6;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar4 = (ImGuiTextRange *)(*GImAllocatorAllocFunc)(uVar11 << 4,GImAllocatorUserData);
    pIVar2 = (this->Filters).Data;
    if (pIVar2 != (ImGuiTextRange *)0x0) {
      memcpy(pIVar4,pIVar2,(long)(this->Filters).Size << 4);
      pIVar2 = (this->Filters).Data;
      if ((pIVar2 != (ImGuiTextRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (this->Filters).Data = pIVar4;
    (this->Filters).Capacity = (int)uVar11;
  }
  uVar11 = 0;
  (this->Filters).Size = 0;
  sVar5 = strlen(this->InputBuf);
  local_38.e = this->InputBuf + sVar5;
  local_38.b = this->InputBuf;
  ImGuiTextRange::split(&local_38,',',&this->Filters);
  this->CountGrep = 0;
  uVar6 = (this->Filters).Size;
  if ((ulong)uVar6 != 0) {
    iVar7 = this->CountGrep;
    pIVar2 = (this->Filters).Data;
    uVar8 = 0;
    if (0 < (int)uVar6) {
      uVar8 = (ulong)uVar6;
    }
    do {
      if (uVar11 == uVar8) {
LAB_0014c176:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                      ,0x66a,
                      "T &ImVector<ImGuiTextFilter::ImGuiTextRange>::operator[](int) [T = ImGuiTextFilter::ImGuiTextRange]"
                     );
      }
      pIVar4 = pIVar2 + uVar11;
      pcVar9 = pIVar2[uVar11].b;
      if (pcVar9 < pIVar2[uVar11].e) {
        do {
          if ((*pcVar9 != ' ') && (*pcVar9 != '\t')) break;
          pcVar9 = pcVar9 + 1;
          pIVar4->b = pcVar9;
        } while (pcVar9 != pIVar2[uVar11].e);
      }
      pcVar3 = pIVar4->e;
      while (pcVar9 < pcVar3) {
        pcVar10 = pcVar3 + -1;
        if ((*pcVar10 != ' ') && (*pcVar10 != '\t')) break;
        pIVar4->e = pcVar10;
        pcVar3 = pcVar10;
      }
      if (pcVar9 != pcVar3) {
        if ((long)(this->Filters).Size <= (long)uVar11) goto LAB_0014c176;
        if (*pcVar9 != '-') {
          iVar7 = iVar7 + 1;
          this->CountGrep = iVar7;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar6);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf + strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        ImGuiTextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}